

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

int * __thiscall
TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_>::Insert
          (TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_> *this,FName *key,int *value)

{
  FName local_30;
  FName local_2c;
  Node *local_28;
  Node *n;
  int *value_local;
  FName *key_local;
  TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_> *this_local;
  
  n = (Node *)value;
  value_local = &key->Index;
  key_local = (FName *)this;
  FName::FName(&local_2c,key);
  local_28 = FindKey(this,&local_2c);
  if (local_28 == (Node *)0x0) {
    FName::FName(&local_30,key);
    local_28 = NewKey(this,&local_30);
    (local_28->Pair).Value = *(int *)&n->Next;
  }
  else {
    (local_28->Pair).Value = *(int *)&n->Next;
  }
  return &(local_28->Pair).Value;
}

Assistant:

VT &Insert(const KT key, const VT &value)
	{
		Node *n = FindKey(key);
		if (n != NULL)
		{
			n->Pair.Value = value;
		}
		else
		{
			n = NewKey(key);
			::new(&n->Pair.Value) VT(value);
		}
		return n->Pair.Value;
	}